

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> * __thiscall
despot::BaseTag::OppTransitionDistribution
          (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
           *__return_storage_ptr__,BaseTag *this,int state)

{
  Floor *this_00;
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  mapped_type *pmVar5;
  int iVar6;
  Coord *coord;
  Coord *coord_00;
  Coord *coord_01;
  Coord *coord_02;
  Coord *coord_03;
  Coord *coord_04;
  mapped_type mVar7;
  Coord opp;
  int iStack_54;
  int local_4c [2];
  Coord local_44 [8];
  int index;
  undefined8 local_38;
  
  coord = &opp;
  coord_00 = &opp;
  coord_01 = &opp;
  coord_02 = &opp;
  coord_03 = &opp;
  coord_04 = &opp;
  this_00 = &this->floor_;
  uVar3 = despot::Floor::GetCell((int)this_00);
  _opp = despot::Floor::GetCell((int)this_00);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((int)_opp == (int)uVar3) {
    despot::Coord::Coord((Coord *)local_4c,1,0);
    uVar4 = despot::operator+(&opp,(Coord *)local_4c);
    cVar2 = despot::Floor::Inside(this_00,uVar4);
    if (cVar2 != '\0') {
      despot::Coord::Coord(local_44,1,0);
      local_38 = despot::operator+(&opp,local_44);
      coord = (Coord *)&local_38;
    }
    index = Floor::GetIndex(this_00,coord);
    pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&index);
    *pmVar5 = *pmVar5 + 0.2;
    despot::Coord::Coord((Coord *)local_4c,-1,0);
    uVar4 = despot::operator+(&opp,(Coord *)local_4c);
    cVar2 = despot::Floor::Inside(this_00,uVar4);
    if (cVar2 != '\0') {
      despot::Coord::Coord(local_44,-1,0);
      local_38 = despot::operator+(&opp,local_44);
      coord_00 = (Coord *)&local_38;
    }
    index = Floor::GetIndex(this_00,coord_00);
    pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&index);
    mVar7 = *pmVar5 + 0.2;
  }
  else {
    iVar6 = (uint)((int)uVar3 < (int)_opp) * 2 + -1;
    despot::Coord::Coord((Coord *)local_4c,iVar6,0);
    uVar4 = despot::operator+(&opp,(Coord *)local_4c);
    cVar2 = despot::Floor::Inside(this_00,uVar4);
    if (cVar2 != '\0') {
      despot::Coord::Coord(local_44,iVar6,0);
      local_38 = despot::operator+(&opp,local_44);
      coord_01 = (Coord *)&local_38;
    }
    index = Floor::GetIndex(this_00,coord_01);
    pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&index);
    mVar7 = *pmVar5 + 0.4;
  }
  *pmVar5 = mVar7;
  iVar6 = (int)((ulong)uVar3 >> 0x20);
  if (iStack_54 == iVar6) {
    despot::Coord::Coord((Coord *)local_4c,0,1);
    despot::operator+(&opp,(Coord *)local_4c);
    cVar2 = despot::Floor::Inside(this_00);
    if (cVar2 != '\0') {
      despot::Coord::Coord(local_44,0,1);
      local_38 = despot::operator+(&opp,local_44);
      coord_02 = (Coord *)&local_38;
    }
    index = Floor::GetIndex(this_00,coord_02);
    pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&index);
    *pmVar5 = *pmVar5 + 0.2;
    despot::Coord::Coord((Coord *)local_4c,0,-1);
    despot::operator+(&opp,(Coord *)local_4c);
    cVar2 = despot::Floor::Inside(this_00);
    if (cVar2 != '\0') {
      despot::Coord::Coord(local_44,0,-1);
      local_38 = despot::operator+(&opp,local_44);
      coord_03 = (Coord *)&local_38;
    }
    index = Floor::GetIndex(this_00,coord_03);
    pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&index);
    mVar7 = *pmVar5 + 0.2;
  }
  else {
    iVar6 = (uint)(iVar6 < iStack_54) * 2 + -1;
    despot::Coord::Coord((Coord *)local_4c,0,iVar6);
    despot::operator+(&opp,(Coord *)local_4c);
    cVar2 = despot::Floor::Inside(this_00);
    if (cVar2 != '\0') {
      despot::Coord::Coord(local_44,0,iVar6);
      local_38 = despot::operator+(&opp,local_44);
      coord_04 = (Coord *)&local_38;
    }
    index = Floor::GetIndex(this_00,coord_04);
    pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&index);
    mVar7 = *pmVar5 + 0.4;
  }
  *pmVar5 = mVar7;
  local_4c[0] = Floor::GetIndex(this_00,&opp);
  pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](__return_storage_ptr__,local_4c);
  *pmVar5 = *pmVar5 + 0.2;
  return __return_storage_ptr__;
}

Assistant:

map<int, double> BaseTag::OppTransitionDistribution(int state) const {
	Coord rob = floor_.GetCell(rob_[state]), opp = floor_.GetCell(opp_[state]);

	map<int, double> distribution;

	if (opp.x == rob.x) {
		int index =
			floor_.Inside(opp + Coord(1, 0)) ?
				floor_.GetIndex(opp + Coord(1, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;

		index =
			floor_.Inside(opp + Coord(-1, 0)) ?
				floor_.GetIndex(opp + Coord(-1, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;
	} else {
		int dx = opp.x > rob.x ? 1 : -1;
		int index =
			floor_.Inside(opp + Coord(dx, 0)) ?
				floor_.GetIndex(opp + Coord(dx, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.4;
	}

	if (opp.y == rob.y) {
		int index =
			floor_.Inside(opp + Coord(0, 1)) ?
				floor_.GetIndex(opp + Coord(0, 1)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;

		index =
			floor_.Inside(opp + Coord(0, -1)) ?
				floor_.GetIndex(opp + Coord(0, -1)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;
	} else {
		int dy = opp.y > rob.y ? 1 : -1;
		int index =
			floor_.Inside(opp + Coord(0, dy)) ?
				floor_.GetIndex(opp + Coord(0, dy)) : floor_.GetIndex(opp);
		distribution[index] += 0.4;
	}

	distribution[floor_.GetIndex(opp)] += 0.2;

	return distribution;
}